

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O0

void __thiscall Assimp::LWO::VColorChannel::Allocate(VColorChannel *this,uint num)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  reference local_20;
  aiColor4D *p;
  uint m;
  uint num_local;
  VColorChannel *this_local;
  
  bVar1 = std::vector<float,_std::allocator<float>_>::empty(&(this->super_VMapEntry).rawData);
  if (bVar1) {
    uVar2 = num * (this->super_VMapEntry).dims;
    std::vector<float,_std::allocator<float>_>::reserve
              (&(this->super_VMapEntry).rawData,(ulong)(uVar2 + (uVar2 >> 2)));
    std::vector<float,_std::allocator<float>_>::resize
              (&(this->super_VMapEntry).rawData,(ulong)uVar2);
    for (local_20 = std::vector<float,_std::allocator<float>_>::operator[]
                              (&(this->super_VMapEntry).rawData,0);
        pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&(this->super_VMapEntry).rawData,(ulong)(uVar2 - 1)), local_20 < pvVar3;
        local_20 = local_20 + 4) {
      local_20[3] = 1.0;
    }
    std::vector<bool,_std::allocator<bool>_>::resize
              (&(this->super_VMapEntry).abAssigned,(ulong)num,false);
  }
  return;
}

Assistant:

virtual void Allocate(unsigned int num)
    {
        if (!rawData.empty())
            return; // return if already allocated

        unsigned int m = num*dims;
        rawData.reserve(m + (m>>2u)); // 25% as  extra storage for VMADs
        rawData.resize(m);

        for (aiColor4D* p = (aiColor4D*)&rawData[0]; p < (aiColor4D*)&rawData[m-1]; ++p)
            p->a = 1.f;

        abAssigned.resize(num,false);
    }